

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O0

void __thiscall
AbstractWrittenFont::AppendGlyphs
          (AbstractWrittenFont *this,GlyphUnicodeMappingListList *inGlyphsList,
          UShortListList *outEncodedCharacters,bool *outEncodingIsMultiByte,
          ObjectIDType *outFontObjectID)

{
  bool bVar1;
  uint uVar2;
  WrittenFontRepresentation *pWVar3;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType OVar4;
  ObjectIDType *outFontObjectID_local;
  bool *outEncodingIsMultiByte_local;
  UShortListList *outEncodedCharacters_local;
  GlyphUnicodeMappingListList *inGlyphsList_local;
  AbstractWrittenFont *this_local;
  
  if ((this->mCIDRepresentation == (WrittenFontRepresentation *)0x0) ||
     (bVar1 = CanEncodeWithIncludedChars
                        (this,this->mCIDRepresentation,inGlyphsList,outEncodedCharacters), !bVar1))
  {
    if ((this->mANSIRepresentation == (WrittenFontRepresentation *)0x0) ||
       (bVar1 = CanEncodeWithIncludedChars
                          (this,this->mANSIRepresentation,inGlyphsList,outEncodedCharacters), !bVar1
       )) {
      if (this->mCIDRepresentation == (WrittenFontRepresentation *)0x0) {
        if (this->mANSIRepresentation == (WrittenFontRepresentation *)0x0) {
          pWVar3 = (WrittenFontRepresentation *)operator_new(0x38);
          WrittenFontRepresentation::WrittenFontRepresentation(pWVar3);
          this->mANSIRepresentation = pWVar3;
        }
        uVar2 = (*(this->super_IWrittenFont)._vptr_IWrittenFont[8])
                          (this,inGlyphsList,outEncodedCharacters);
        if ((uVar2 & 1) == 0) {
          pWVar3 = (WrittenFontRepresentation *)operator_new(0x38);
          WrittenFontRepresentation::WrittenFontRepresentation(pWVar3);
          this->mCIDRepresentation = pWVar3;
          AddToCIDRepresentation(this,inGlyphsList,outEncodedCharacters);
          *outFontObjectID = this->mCIDRepresentation->mWrittenObjectID;
          *outEncodingIsMultiByte = true;
        }
        else {
          if (this->mANSIRepresentation->mWrittenObjectID == 0) {
            this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
            OVar4 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
            this->mANSIRepresentation->mWrittenObjectID = OVar4;
          }
          *outFontObjectID = this->mANSIRepresentation->mWrittenObjectID;
          *outEncodingIsMultiByte = false;
        }
      }
      else {
        AddToCIDRepresentation(this,inGlyphsList,outEncodedCharacters);
        *outFontObjectID = this->mCIDRepresentation->mWrittenObjectID;
        *outEncodingIsMultiByte = true;
      }
    }
    else {
      *outFontObjectID = this->mANSIRepresentation->mWrittenObjectID;
      *outEncodingIsMultiByte = false;
    }
  }
  else {
    *outFontObjectID = this->mCIDRepresentation->mWrittenObjectID;
    *outEncodingIsMultiByte = true;
  }
  return;
}

Assistant:

void AbstractWrittenFont::AppendGlyphs(	const GlyphUnicodeMappingListList& inGlyphsList,
										UShortListList& outEncodedCharacters,
										bool& outEncodingIsMultiByte,
										ObjectIDType &outFontObjectID)
{
	// same as the regular one, but with lists of strings

	if(mCIDRepresentation && CanEncodeWithIncludedChars(mCIDRepresentation,inGlyphsList,outEncodedCharacters))
	{
		outFontObjectID = mCIDRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = true;
		return;
	}

	if(mANSIRepresentation && CanEncodeWithIncludedChars(mANSIRepresentation,inGlyphsList,outEncodedCharacters))
	{
		outFontObjectID = mANSIRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = false;
		return;
	}

	if(mCIDRepresentation)
	{
		AddToCIDRepresentation(inGlyphsList,outEncodedCharacters);
		outFontObjectID = mCIDRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = true;
		return;
	}

	if(!mANSIRepresentation)
		mANSIRepresentation = new WrittenFontRepresentation();

	if(AddToANSIRepresentation(inGlyphsList,outEncodedCharacters))
	{
		if(0 == mANSIRepresentation->mWrittenObjectID)
			mANSIRepresentation->mWrittenObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

		outFontObjectID = mANSIRepresentation->mWrittenObjectID;
		outEncodingIsMultiByte = false;
		return;			
	}

	mCIDRepresentation = new WrittenFontRepresentation();
	AddToCIDRepresentation(inGlyphsList,outEncodedCharacters);
	outFontObjectID = mCIDRepresentation->mWrittenObjectID;
	outEncodingIsMultiByte = true;
}